

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::VariableParameter::Decode(VariableParameter *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KUINT8 i;
  long lVar2;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    KDataStream::Read(stream,&this->m_ui8VarParamType);
    lVar2 = 0;
    do {
      KDataStream::Read(stream,this->m_Data + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xf);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void VariableParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VARIABLE_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

	stream >> m_ui8VarParamType;
		
	for( KUINT8 i = 0; i < 15; ++i )
	{
		stream >> m_Data[i];
	}
}